

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::DescriptorProto::SharedDtor(DescriptorProto *this)

{
  string *psVar1;
  pointer pcVar2;
  MessageOptions *this_00;
  LogMessage *other;
  void *pvVar3;
  LogMessage local_60;
  LogFinisher local_21;
  
  pvVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    pvVar3 = *(void **)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  if (pvVar3 != (void *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/descriptor.pb.cc"
               ,0xb40);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: GetArena() == nullptr: ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  psVar1 = (this->name_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  if ((this != (DescriptorProto *)_DescriptorProto_default_instance_) &&
     (this_00 = this->options_, this_00 != (MessageOptions *)0x0)) {
    MessageOptions::~MessageOptions(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

void DescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
}